

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buddy_allocator.h
# Opt level: O0

page * __thiscall cppcms::impl::buddy_allocator::get_buddy(buddy_allocator *this,page *p)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  undefined4 *in_RSI;
  buddy_allocator *in_RDI;
  size_t b_ptr;
  size_t p_len;
  size_t p_ptr;
  page *local_8;
  
  pcVar1 = memory(in_RDI);
  uVar2 = 1L << ((byte)*in_RSI & 0x3f);
  uVar3 = uVar2 ^ (long)in_RSI - (long)pcVar1;
  if (in_RDI->memory_size_ < uVar3 + uVar2) {
    local_8 = (page *)0x0;
  }
  else {
    pcVar1 = memory(in_RDI);
    local_8 = (page *)(pcVar1 + uVar3);
  }
  return local_8;
}

Assistant:

page *get_buddy(page *p)
	{
		size_t p_ptr = reinterpret_cast<char *>(p) - memory();
		size_t p_len = size_t(1) << p->bits;
		size_t b_ptr = p_len ^ p_ptr;
		if(b_ptr + p_len > memory_size_)
			return 0;
		return reinterpret_cast<page *>(b_ptr + memory());
	}